

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::EnumParseTester::Clear(EnumParseTester *this)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t cached_has_bits;
  EnumParseTester *this_local;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  google::protobuf::RepeatedField<int>::Clear
            (&(this->field_0)._impl_.repeated_seq_small_0_lowfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_seq_small_0_lowfield_);
  google::protobuf::RepeatedField<int>::Clear
            (&(this->field_0)._impl_.repeated_seq_small_1_lowfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_seq_small_1_lowfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_seq_large_lowfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_seq_large_lowfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_arbitrary_lowfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_arbitrary_lowfield_);
  google::protobuf::RepeatedField<int>::Clear
            (&(this->field_0)._impl_.repeated_seq_small_0_midfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_seq_small_0_midfield_);
  google::protobuf::RepeatedField<int>::Clear
            (&(this->field_0)._impl_.repeated_seq_small_1_midfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_seq_small_1_midfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_seq_large_midfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_seq_large_midfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_arbitrary_midfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_arbitrary_midfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_seq_small_0_hifield_)
  ;
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_seq_small_0_hifield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_seq_small_1_hifield_)
  ;
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_seq_small_1_hifield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_seq_large_hifield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_seq_large_hifield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_arbitrary_hifield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_arbitrary_hifield_);
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 0xff) != 0) {
    memset((void *)((long)&this->field_0 + 0x25c),0,0x1c);
    (this->field_0)._impl_.optional_seq_large_lowfield_ = -1;
  }
  if ((uVar1 & 0x1f00) != 0) {
    (this->field_0)._impl_.optional_arbitrary_lowfield_ = -0x1e0f3;
    (this->field_0)._impl_.optional_seq_large_midfield_ = -1;
    (this->field_0)._impl_.optional_arbitrary_midfield_ = -0x1e0f3;
    (this->field_0)._impl_.optional_seq_large_hifield_ = -1;
    (this->field_0)._impl_.optional_arbitrary_hifield_ = -0x1e0f3;
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void EnumParseTester::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.EnumParseTester)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.repeated_seq_small_0_lowfield_.Clear();
  _impl_.packed_seq_small_0_lowfield_.Clear();
  _impl_.repeated_seq_small_1_lowfield_.Clear();
  _impl_.packed_seq_small_1_lowfield_.Clear();
  _impl_.repeated_seq_large_lowfield_.Clear();
  _impl_.packed_seq_large_lowfield_.Clear();
  _impl_.repeated_arbitrary_lowfield_.Clear();
  _impl_.packed_arbitrary_lowfield_.Clear();
  _impl_.repeated_seq_small_0_midfield_.Clear();
  _impl_.packed_seq_small_0_midfield_.Clear();
  _impl_.repeated_seq_small_1_midfield_.Clear();
  _impl_.packed_seq_small_1_midfield_.Clear();
  _impl_.repeated_seq_large_midfield_.Clear();
  _impl_.packed_seq_large_midfield_.Clear();
  _impl_.repeated_arbitrary_midfield_.Clear();
  _impl_.packed_arbitrary_midfield_.Clear();
  _impl_.repeated_seq_small_0_hifield_.Clear();
  _impl_.packed_seq_small_0_hifield_.Clear();
  _impl_.repeated_seq_small_1_hifield_.Clear();
  _impl_.packed_seq_small_1_hifield_.Clear();
  _impl_.repeated_seq_large_hifield_.Clear();
  _impl_.packed_seq_large_hifield_.Clear();
  _impl_.repeated_arbitrary_hifield_.Clear();
  _impl_.packed_arbitrary_hifield_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    ::memset(&_impl_.optional_seq_small_0_lowfield_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_seq_small_1_midfield_) -
        reinterpret_cast<char*>(&_impl_.optional_seq_small_0_lowfield_)) + sizeof(_impl_.optional_seq_small_1_midfield_));
    _impl_.optional_seq_large_lowfield_ = -1;
  }
  if ((cached_has_bits & 0x00001f00u) != 0) {
    _impl_.optional_arbitrary_lowfield_ = -123123;
    _impl_.optional_seq_large_midfield_ = -1;
    _impl_.optional_arbitrary_midfield_ = -123123;
    _impl_.optional_seq_large_hifield_ = -1;
    _impl_.optional_arbitrary_hifield_ = -123123;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}